

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_dispatch.cpp
# Opt level: O3

void __kmp_dispatch_init<long_long>
               (ident_t *loc,int gtid,sched_type schedule,longlong lb,longlong ub,
               signed_t_conflict st,signed_t_conflict chunk,int push_ws)

{
  longlong *plVar1;
  int iVar2;
  uint checker;
  kmp_info_t *pkVar3;
  kmp_team_p *pkVar4;
  kmp_disp_t *pkVar5;
  dispatch_shared_info_t *pdVar6;
  ident_t *piVar7;
  ulong uVar8;
  kmp_info_t **ppkVar9;
  dispatch_private_info_t *pdVar10;
  ompt_data_t *poVar11;
  ompt_task_info_t *poVar12;
  uint uVar13;
  code *obj;
  code *pcVar14;
  char *pcVar15;
  dispatch_private_info_template<long_long> *pr;
  kmp_uint64 sched_type;
  long lVar16;
  void *pvVar17;
  bool bVar18;
  kmp_uint64 cur_chunk;
  uint local_74;
  ulong local_70;
  longlong local_68;
  longlong local_60;
  signed_t_conflict local_58;
  long local_50;
  dispatch_private_info_t *local_48;
  dispatch_private_info_template<long_long> *local_40;
  dispatch_shared_info_t *local_38;
  
  local_68 = lb;
  local_60 = ub;
  local_58 = st;
  if (__kmp_init_parallel == 0) {
    __kmp_parallel_initialize();
  }
  __kmp_resume_if_soft_paused();
  ppkVar9 = __kmp_threads;
  lVar16 = (long)gtid;
  pkVar3 = __kmp_threads[lVar16];
  pkVar4 = (pkVar3->th).th_team;
  iVar2 = (pkVar4->t).t_serialized;
  (pkVar3->th).th_ident = loc;
  cur_chunk = chunk;
  uVar13 = 0;
  if ((__kmp_itt_metadata_add_ptr__3_0 != (__kmp_itt_metadata_add_t *)0x0) &&
     (__kmp_forkjoin_frames_mode == 3)) {
    if ((*(int *)(ppkVar9[lVar16]->th_pad + 0x20) == 0) &&
       ((pkVar3->th).th_teams_microtask == (microtask_t)0x0)) {
      uVar13 = (uint)((pkVar4->t).t_active_level == 1);
    }
    else {
      uVar13 = 0;
    }
  }
  pkVar5 = (pkVar3->th).th_dispatch;
  if (iVar2 == 0) {
    checker = pkVar5->th_disp_index;
    pkVar5->th_disp_index = checker + 1;
    local_48 = ((pkVar3->th).th_dispatch)->th_disp_buffer;
    uVar8 = (ulong)checker % (ulong)(uint)__kmp_dispatch_num_buffers;
    local_40 = (dispatch_private_info_template<long_long> *)(local_48 + uVar8);
    pdVar6 = (pkVar4->t).t_disp_buffer;
    local_38 = pdVar6 + uVar8;
    local_74 = uVar13;
    local_70 = (ulong)schedule;
    local_50 = lVar16;
    __kmp_dispatch_init_algorithm<long_long>
              (loc,gtid,local_40,schedule,local_68,local_60,local_58,&cur_chunk,chunk,
               (long)(pkVar3->th).th_team_nproc,(long)*(int *)(pkVar3->th_pad + 0x20));
    pr = local_40;
    pdVar10 = local_48;
    bVar18 = ((uint)local_48[uVar8].flags & 1) == 0;
    obj = __kmp_dispatch_deo<unsigned_long_long>;
    if (bVar18) {
      obj = __kmp_dispatch_deo_error;
    }
    pcVar14 = __kmp_dispatch_dxo<unsigned_long_long>;
    if (bVar18) {
      pcVar14 = __kmp_dispatch_dxo_error;
    }
    ((pkVar3->th).th_dispatch)->th_deo_fcn = obj;
    ((pkVar3->th).th_dispatch)->th_dxo_fcn = pcVar14;
    __kmp_wait<unsigned_int>(&pdVar6[uVar8].buffer_index,checker,__kmp_eq<unsigned_int>,obj);
    ((pkVar3->th).th_dispatch)->th_dispatch_pr_current = (dispatch_private_info_t *)pr;
    ((pkVar3->th).th_dispatch)->th_dispatch_sh_current = local_38;
    if ((((uint)pdVar10[uVar8].flags & 1) != 0) &&
       (__kmp_itt_sync_create_ptr__3_0 != (undefined1 *)0x0)) {
      piVar7 = (__kmp_threads[local_50]->th).th_ident;
      if (piVar7 == (ident_t *)0x0) {
        pcVar15 = (char *)0x0;
      }
      else {
        pcVar15 = piVar7->psource;
      }
      (*(code *)__kmp_itt_sync_create_ptr__3_0)
                (((__kmp_threads[local_50]->th).th_dispatch)->th_dispatch_sh_current,"OMP Ordered",
                 pcVar15,0);
    }
    schedule = (sched_type)local_70;
    if ((char)local_74 != '\0') {
      switch(schedule) {
      default:
        sched_type = 3;
        break;
      case kmp_sch_dynamic_chunked:
        sched_type = 1;
        break;
      case kmp_sch_static_greedy:
        cur_chunk = (pr->u).p.field_6.parm1;
      case kmp_sch_static_chunked:
      case kmp_sch_static_balanced:
        sched_type = 0;
        break;
      case kmp_sch_guided_iterative_chunked:
      case kmp_sch_guided_analytical_chunked:
      case kmp_sch_guided_simd:
        sched_type = 2;
      }
      __kmp_itt_metadata_loop(loc,sched_type,(pr->u).p.tc,cur_chunk);
    }
  }
  else {
    pr = (dispatch_private_info_template<long_long> *)pkVar5->th_disp_buffer;
    __kmp_dispatch_init_algorithm<long_long>
              (loc,gtid,pr,schedule,local_68,local_60,local_58,&cur_chunk,chunk,
               (long)(pkVar3->th).th_team_nproc,(long)*(int *)(pkVar3->th_pad + 0x20));
  }
  if (schedule == kmp_sch_static_steal) {
    plVar1 = &(pr->u).p.static_steal_counter;
    *plVar1 = *plVar1 + 1;
  }
  if ((ompt_enabled._2_1_ & 0x10) != 0) {
    poVar11 = &__ompt_get_teaminfo(0,(int *)0x0)->parallel_data;
    poVar12 = __ompt_get_task_info_object(0);
    pvVar17 = (pkVar3->th).ompt_thread_info.return_address;
    if (pvVar17 == (void *)0x0) {
      pvVar17 = poVar11[1].ptr;
    }
    (*ompt_callbacks.ompt_callback_work_callback)
              (ompt_work_loop,ompt_scope_begin,poVar11,&poVar12->task_data,(pr->u).p.tc,pvVar17);
  }
  return;
}

Assistant:

static void
__kmp_dispatch_init(ident_t *loc, int gtid, enum sched_type schedule, T lb,
                    T ub, typename traits_t<T>::signed_t st,
                    typename traits_t<T>::signed_t chunk, int push_ws) {
  typedef typename traits_t<T>::unsigned_t UT;

  int active;
  kmp_info_t *th;
  kmp_team_t *team;
  kmp_uint32 my_buffer_index;
  dispatch_private_info_template<T> *pr;
  dispatch_shared_info_template<T> volatile *sh;

  KMP_BUILD_ASSERT(sizeof(dispatch_private_info_template<T>) ==
                   sizeof(dispatch_private_info));
  KMP_BUILD_ASSERT(sizeof(dispatch_shared_info_template<UT>) ==
                   sizeof(dispatch_shared_info));

  if (!TCR_4(__kmp_init_parallel))
    __kmp_parallel_initialize();

  __kmp_resume_if_soft_paused();

#if INCLUDE_SSC_MARKS
  SSC_MARK_DISPATCH_INIT();
#endif
#ifdef KMP_DEBUG
  typedef typename traits_t<T>::signed_t ST;
  {
    char *buff;
    // create format specifiers before the debug output
    buff = __kmp_str_format("__kmp_dispatch_init: T#%%d called: schedule:%%d "
                            "chunk:%%%s lb:%%%s ub:%%%s st:%%%s\n",
                            traits_t<ST>::spec, traits_t<T>::spec,
                            traits_t<T>::spec, traits_t<ST>::spec);
    KD_TRACE(10, (buff, gtid, schedule, chunk, lb, ub, st));
    __kmp_str_free(&buff);
  }
#endif
  /* setup data */
  th = __kmp_threads[gtid];
  team = th->th.th_team;
  active = !team->t.t_serialized;
  th->th.th_ident = loc;

  // Any half-decent optimizer will remove this test when the blocks are empty
  // since the macros expand to nothing
  // when statistics are disabled.
  if (schedule == __kmp_static) {
    KMP_COUNT_BLOCK(OMP_LOOP_STATIC);
  } else {
    KMP_COUNT_BLOCK(OMP_LOOP_DYNAMIC);
  }

#if KMP_USE_HIER_SCHED
  // Initialize the scheduling hierarchy if requested in OMP_SCHEDULE envirable
  // Hierarchical scheduling does not work with ordered, so if ordered is
  // detected, then revert back to threaded scheduling.
  bool ordered;
  enum sched_type my_sched = schedule;
  my_buffer_index = th->th.th_dispatch->th_disp_index;
  pr = reinterpret_cast<dispatch_private_info_template<T> *>(
      &th->th.th_dispatch
           ->th_disp_buffer[my_buffer_index % __kmp_dispatch_num_buffers]);
  my_sched = SCHEDULE_WITHOUT_MODIFIERS(my_sched);
  if ((my_sched >= kmp_nm_lower) && (my_sched < kmp_nm_upper))
    my_sched =
        (enum sched_type)(((int)my_sched) - (kmp_nm_lower - kmp_sch_lower));
  ordered = (kmp_ord_lower & my_sched);
  if (pr->flags.use_hier) {
    if (ordered) {
      KD_TRACE(100, ("__kmp_dispatch_init: T#%d ordered loop detected.  "
                     "Disabling hierarchical scheduling.\n",
                     gtid));
      pr->flags.use_hier = FALSE;
    }
  }
  if (schedule == kmp_sch_runtime && __kmp_hier_scheds.size > 0) {
    // Don't use hierarchical for ordered parallel loops and don't
    // use the runtime hierarchy if one was specified in the program
    if (!ordered && !pr->flags.use_hier)
      __kmp_dispatch_init_hier_runtime<T>(loc, lb, ub, st);
  }
#endif // KMP_USE_HIER_SCHED

#if USE_ITT_BUILD
  kmp_uint64 cur_chunk = chunk;
  int itt_need_metadata_reporting =
      __itt_metadata_add_ptr && __kmp_forkjoin_frames_mode == 3 &&
      KMP_MASTER_GTID(gtid) && th->th.th_teams_microtask == NULL &&
      team->t.t_active_level == 1;
#endif
  if (!active) {
    pr = reinterpret_cast<dispatch_private_info_template<T> *>(
        th->th.th_dispatch->th_disp_buffer); /* top of the stack */
  } else {
    KMP_DEBUG_ASSERT(th->th.th_dispatch ==
                     &th->th.th_team->t.t_dispatch[th->th.th_info.ds.ds_tid]);

    my_buffer_index = th->th.th_dispatch->th_disp_index++;

    /* What happens when number of threads changes, need to resize buffer? */
    pr = reinterpret_cast<dispatch_private_info_template<T> *>(
        &th->th.th_dispatch
             ->th_disp_buffer[my_buffer_index % __kmp_dispatch_num_buffers]);
    sh = reinterpret_cast<dispatch_shared_info_template<T> volatile *>(
        &team->t.t_disp_buffer[my_buffer_index % __kmp_dispatch_num_buffers]);
    KD_TRACE(10, ("__kmp_dispatch_init: T#%d my_buffer_index:%d\n", gtid,
                  my_buffer_index));
  }

  __kmp_dispatch_init_algorithm(loc, gtid, pr, schedule, lb, ub, st,
#if USE_ITT_BUILD
                                &cur_chunk,
#endif
                                chunk, (T)th->th.th_team_nproc,
                                (T)th->th.th_info.ds.ds_tid);
  if (active) {
    if (pr->flags.ordered == 0) {
      th->th.th_dispatch->th_deo_fcn = __kmp_dispatch_deo_error;
      th->th.th_dispatch->th_dxo_fcn = __kmp_dispatch_dxo_error;
    } else {
      th->th.th_dispatch->th_deo_fcn = __kmp_dispatch_deo<UT>;
      th->th.th_dispatch->th_dxo_fcn = __kmp_dispatch_dxo<UT>;
    }
  }

  if (active) {
    /* The name of this buffer should be my_buffer_index when it's free to use
     * it */

    KD_TRACE(100, ("__kmp_dispatch_init: T#%d before wait: my_buffer_index:%d "
                   "sh->buffer_index:%d\n",
                   gtid, my_buffer_index, sh->buffer_index));
    __kmp_wait<kmp_uint32>(&sh->buffer_index, my_buffer_index,
                           __kmp_eq<kmp_uint32> USE_ITT_BUILD_ARG(NULL));
    // Note: KMP_WAIT() cannot be used there: buffer index and
    // my_buffer_index are *always* 32-bit integers.
    KMP_MB(); /* is this necessary? */
    KD_TRACE(100, ("__kmp_dispatch_init: T#%d after wait: my_buffer_index:%d "
                   "sh->buffer_index:%d\n",
                   gtid, my_buffer_index, sh->buffer_index));

    th->th.th_dispatch->th_dispatch_pr_current = (dispatch_private_info_t *)pr;
    th->th.th_dispatch->th_dispatch_sh_current =
        CCAST(dispatch_shared_info_t *, (volatile dispatch_shared_info_t *)sh);
#if USE_ITT_BUILD
    if (pr->flags.ordered) {
      __kmp_itt_ordered_init(gtid);
    }
    // Report loop metadata
    if (itt_need_metadata_reporting) {
      // Only report metadata by master of active team at level 1
      kmp_uint64 schedtype = 0;
      switch (schedule) {
      case kmp_sch_static_chunked:
      case kmp_sch_static_balanced: // Chunk is calculated in the switch above
        break;
      case kmp_sch_static_greedy:
        cur_chunk = pr->u.p.parm1;
        break;
      case kmp_sch_dynamic_chunked:
        schedtype = 1;
        break;
      case kmp_sch_guided_iterative_chunked:
      case kmp_sch_guided_analytical_chunked:
      case kmp_sch_guided_simd:
        schedtype = 2;
        break;
      default:
        // Should we put this case under "static"?
        // case kmp_sch_static_steal:
        schedtype = 3;
        break;
      }
      __kmp_itt_metadata_loop(loc, schedtype, pr->u.p.tc, cur_chunk);
    }
#if KMP_USE_HIER_SCHED
    if (pr->flags.use_hier) {
      pr->u.p.count = 0;
      pr->u.p.ub = pr->u.p.lb = pr->u.p.st = pr->u.p.tc = 0;
    }
#endif // KMP_USER_HIER_SCHED
#endif /* USE_ITT_BUILD */
  }

#ifdef KMP_DEBUG
  {
    char *buff;
    // create format specifiers before the debug output
    buff = __kmp_str_format(
        "__kmp_dispatch_init: T#%%d returning: schedule:%%d ordered:%%%s "
        "lb:%%%s ub:%%%s"
        " st:%%%s tc:%%%s count:%%%s\n\tordered_lower:%%%s ordered_upper:%%%s"
        " parm1:%%%s parm2:%%%s parm3:%%%s parm4:%%%s\n",
        traits_t<UT>::spec, traits_t<T>::spec, traits_t<T>::spec,
        traits_t<ST>::spec, traits_t<UT>::spec, traits_t<UT>::spec,
        traits_t<UT>::spec, traits_t<UT>::spec, traits_t<T>::spec,
        traits_t<T>::spec, traits_t<T>::spec, traits_t<T>::spec);
    KD_TRACE(10, (buff, gtid, pr->schedule, pr->flags.ordered, pr->u.p.lb,
                  pr->u.p.ub, pr->u.p.st, pr->u.p.tc, pr->u.p.count,
                  pr->u.p.ordered_lower, pr->u.p.ordered_upper, pr->u.p.parm1,
                  pr->u.p.parm2, pr->u.p.parm3, pr->u.p.parm4));
    __kmp_str_free(&buff);
  }
#endif
#if (KMP_STATIC_STEAL_ENABLED)
  // It cannot be guaranteed that after execution of a loop with some other
  // schedule kind all the parm3 variables will contain the same value. Even if
  // all parm3 will be the same, it still exists a bad case like using 0 and 1
  // rather than program life-time increment. So the dedicated variable is
  // required. The 'static_steal_counter' is used.
  if (schedule == kmp_sch_static_steal) {
    // Other threads will inspect this variable when searching for a victim.
    // This is a flag showing that other threads may steal from this thread
    // since then.
    volatile T *p = &pr->u.p.static_steal_counter;
    *p = *p + 1;
  }
#endif // ( KMP_STATIC_STEAL_ENABLED )

#if OMPT_SUPPORT && OMPT_OPTIONAL
  if (ompt_enabled.ompt_callback_work) {
    ompt_team_info_t *team_info = __ompt_get_teaminfo(0, NULL);
    ompt_task_info_t *task_info = __ompt_get_task_info_object(0);
    ompt_callbacks.ompt_callback(ompt_callback_work)(
        ompt_work_loop, ompt_scope_begin, &(team_info->parallel_data),
        &(task_info->task_data), pr->u.p.tc,
        (th->th.ompt_thread_info.return_address)
            ? (th->th.ompt_thread_info.return_address)
            : team_info->master_return_address);
  }
#endif
  KMP_PUSH_PARTITIONED_TIMER(OMP_loop_dynamic);
}